

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O0

void __thiscall
QNetworkAccessManagerPrivate::authenticationRequired
          (QNetworkAccessManagerPrivate *this,QAuthenticator *authenticator,QNetworkReply *reply,
          bool synchronous,QUrl *url,QUrl *urlForLastAuthentication,bool allowAuthenticationReuse)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  byte in_CL;
  QAuthenticator *in_RSI;
  QNetworkAccessManagerPrivate *in_RDI;
  QNetworkAccessAuthenticationManager *in_R8;
  QUrl *in_R9;
  long in_FS_OFFSET;
  byte in_stack_00000008;
  QNetworkAccessManager *q;
  QNetworkAuthenticationCredential cred;
  undefined4 in_stack_fffffffffffffdb8;
  ComponentFormattingOption in_stack_fffffffffffffdbc;
  undefined7 in_stack_fffffffffffffdc0;
  byte in_stack_fffffffffffffdc7;
  QNetworkReply *in_stack_fffffffffffffdc8;
  bool local_222;
  bool local_221;
  QAuthenticator *in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  byte in_stack_fffffffffffffe07;
  QNetworkAccessAuthenticationManager *in_stack_fffffffffffffe08;
  QNetworkAccessAuthenticationManager *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  QNetworkAccessAuthenticationManager *in_stack_fffffffffffffe20;
  bool local_1c9;
  undefined1 local_140 [48];
  QNetworkReply aQStack_110 [2];
  undefined1 local_f0 [32];
  undefined1 local_d0 [56];
  undefined1 local_98 [56];
  undefined1 local_60 [32];
  undefined1 local_40 [32];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (((in_stack_00000008 & 1) != 0) &&
     ((uVar6 = QUrl::isEmpty(), (uVar6 & 1) != 0 ||
      (bVar3 = ::operator!=((QUrl *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                            (QUrl *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8)),
      bVar3)))) {
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)
               CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdbc);
    QUrl::userName((QFlags_conflict *)local_20);
    bVar4 = QString::isEmpty((QString *)0x19ea8d);
    bVar2 = false;
    bVar5 = false;
    bVar1 = false;
    bVar3 = false;
    local_1c9 = false;
    if (!bVar4) {
      in_stack_fffffffffffffe20 = in_R8;
      QFlags<QUrl::ComponentFormattingOption>::QFlags
                ((QFlags<QUrl::ComponentFormattingOption> *)
                 CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                 in_stack_fffffffffffffdbc);
      QUrl::password((QFlags_conflict *)local_40);
      bVar2 = true;
      bVar4 = QString::isEmpty((QString *)0x19eb13);
      local_1c9 = false;
      if (!bVar4) {
        in_stack_fffffffffffffe10 = in_R8;
        QFlags<QUrl::ComponentFormattingOption>::QFlags
                  ((QFlags<QUrl::ComponentFormattingOption> *)
                   CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                   in_stack_fffffffffffffdbc);
        QUrl::userName((QFlags_conflict *)local_60);
        bVar5 = true;
        QAuthenticator::user((QAuthenticator *)in_stack_fffffffffffffdc8);
        bVar1 = true;
        bVar3 = ::operator!=((QString *)
                             CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        in_stack_fffffffffffffe1f = true;
        bVar3 = !bVar3;
        local_1c9 = (bool)in_stack_fffffffffffffe1f;
        if (bVar3) {
          in_stack_fffffffffffffe08 = in_R8;
          QFlags<QUrl::ComponentFormattingOption>::QFlags
                    ((QFlags<QUrl::ComponentFormattingOption> *)
                     CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                     in_stack_fffffffffffffdbc);
          QUrl::password((QFlags_conflict *)local_98);
          QAuthenticator::password((QAuthenticator *)in_stack_fffffffffffffdc8);
          in_stack_fffffffffffffe1f =
               ::operator!=((QString *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0)
                            ,(QString *)
                             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          local_1c9 = (bool)in_stack_fffffffffffffe1f;
        }
      }
    }
    in_stack_fffffffffffffe07 = local_1c9;
    if (bVar3) {
      QString::~QString((QString *)0x19ec42);
      QString::~QString((QString *)0x19ec5b);
      in_stack_fffffffffffffe07 = local_1c9;
    }
    if (bVar1) {
      QString::~QString((QString *)0x19ec74);
    }
    if (bVar5) {
      QString::~QString((QString *)0x19ec8d);
    }
    if (bVar2) {
      QString::~QString((QString *)0x19eca6);
    }
    QString::~QString((QString *)0x19ecb3);
    if ((in_stack_fffffffffffffe07 & 1) != 0) {
      QFlags<QUrl::ComponentFormattingOption>::QFlags
                ((QFlags<QUrl::ComponentFormattingOption> *)
                 CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                 in_stack_fffffffffffffdbc);
      QUrl::userName((QFlags_conflict *)local_d0);
      QAuthenticator::setUser
                ((QAuthenticator *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                 (QString *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      QString::~QString((QString *)0x19ed24);
      QFlags<QUrl::ComponentFormattingOption>::QFlags
                ((QFlags<QUrl::ComponentFormattingOption> *)
                 CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                 in_stack_fffffffffffffdbc);
      QUrl::password((QFlags_conflict *)local_f0);
      QAuthenticator::setPassword
                ((QAuthenticator *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                 (QString *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      QString::~QString((QString *)0x19ed88);
      QUrl::operator=(in_R9,(QUrl *)in_R8);
      std::
      __shared_ptr_access<QNetworkAccessAuthenticationManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<QNetworkAccessAuthenticationManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x19edb1);
      QNetworkAccessAuthenticationManager::cacheCredentials
                (in_stack_fffffffffffffe08,
                 (QUrl *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),in_RSI);
      goto LAB_0019f015;
    }
    memset(local_140,0xaa,0x48);
    std::
    __shared_ptr_access<QNetworkAccessAuthenticationManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<QNetworkAccessAuthenticationManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x19edf9);
    QNetworkAccessAuthenticationManager::fetchCachedCredentials
              (in_stack_fffffffffffffe20,
               (QUrl *)CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
               (QAuthenticator *)in_stack_fffffffffffffe10);
    bVar5 = QNetworkAuthenticationCredential::isNull
                      ((QNetworkAuthenticationCredential *)
                       CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
    bVar1 = false;
    bVar3 = false;
    local_221 = false;
    if (!bVar5) {
      QAuthenticator::user((QAuthenticator *)in_stack_fffffffffffffdc8);
      bVar1 = true;
      bVar3 = ::operator!=((QString *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                           (QString *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8))
      ;
      local_222 = true;
      bVar3 = !bVar3;
      if (bVar3) {
        in_stack_fffffffffffffdc8 = aQStack_110;
        QAuthenticator::password((QAuthenticator *)in_stack_fffffffffffffdc8);
        local_222 = ::operator!=((QString *)
                                 CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      }
      local_221 = local_222;
    }
    in_stack_fffffffffffffdc7 = local_221;
    if (bVar3) {
      QString::~QString((QString *)0x19ef01);
      in_stack_fffffffffffffdc7 = local_221;
    }
    if (bVar1) {
      QString::~QString((QString *)0x19ef1a);
    }
    bVar3 = (in_stack_fffffffffffffdc7 & 1) != 0;
    if (bVar3) {
      QAuthenticator::setUser
                ((QAuthenticator *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                 (QString *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      QAuthenticator::setPassword
                ((QAuthenticator *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
                 (QString *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      QUrl::operator=(in_R9,(QUrl *)in_R8);
    }
    QNetworkAuthenticationCredential::~QNetworkAuthenticationCredential
              ((QNetworkAuthenticationCredential *)
               CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
    if (bVar3) goto LAB_0019f015;
  }
  if ((in_CL & 1) == 0) {
    QUrl::operator=(in_R9,(QUrl *)in_R8);
    QNetworkAccessManager::authenticationRequired
              ((QNetworkAccessManager *)
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdc8,
               (QAuthenticator *)CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
    if ((in_stack_00000008 & 1) != 0) {
      std::
      __shared_ptr_access<QNetworkAccessAuthenticationManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<QNetworkAccessAuthenticationManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x19effd);
      QNetworkAccessAuthenticationManager::cacheCredentials
                (in_stack_fffffffffffffe08,
                 (QUrl *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                 in_stack_fffffffffffffdf8);
    }
  }
LAB_0019f015:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessManagerPrivate::authenticationRequired(QAuthenticator *authenticator,
                                                          QNetworkReply *reply,
                                                          bool synchronous,
                                                          QUrl &url,
                                                          QUrl *urlForLastAuthentication,
                                                          bool allowAuthenticationReuse)
{
    Q_Q(QNetworkAccessManager);

    // don't try the cache for the same URL twice in a row
    // being called twice for the same URL means the authentication failed
    // also called when last URL is empty, e.g. on first call
    if (allowAuthenticationReuse && (urlForLastAuthentication->isEmpty()
            || url != *urlForLastAuthentication)) {
        // if credentials are included in the url, then use them, unless they were already used
        if (!url.userName().isEmpty() && !url.password().isEmpty()
            && (url.userName() != authenticator->user()
                || url.password() != authenticator->password())) {
            authenticator->setUser(url.userName(QUrl::FullyDecoded));
            authenticator->setPassword(url.password(QUrl::FullyDecoded));
            *urlForLastAuthentication = url;
            authenticationManager->cacheCredentials(url, authenticator);
            return;
        }

        QNetworkAuthenticationCredential cred = authenticationManager->fetchCachedCredentials(url, authenticator);
        if (!cred.isNull()
            && (cred.user != authenticator->user() || cred.password != authenticator->password())) {
            authenticator->setUser(cred.user);
            authenticator->setPassword(cred.password);
            *urlForLastAuthentication = url;
            return;
        }
    }

    // if we emit a signal here in synchronous mode, the user might spin
    // an event loop, which might recurse and lead to problems
    if (synchronous)
        return;

    *urlForLastAuthentication = url;
    emit q->authenticationRequired(reply, authenticator);
    if (allowAuthenticationReuse)
        authenticationManager->cacheCredentials(url, authenticator);
}